

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

void __thiscall ProfileHandler::GetState(ProfileHandler *this,ProfileHandlerState *state)

{
  SpinLockHolder local_b8;
  SpinLockHolder sl;
  undefined1 local_a0 [8];
  ScopedSignalBlocker block;
  SpinLockHolder cl;
  ProfileHandlerState *state_local;
  ProfileHandler *this_local;
  
  SpinLockHolder::SpinLockHolder
            ((SpinLockHolder *)(block.sig_set_.__val + 0xf),&this->control_lock_);
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_a0,this->signal_number_);
  SpinLockHolder::SpinLockHolder(&local_b8,&this->signal_lock_);
  state->interrupts = this->interrupts_;
  SpinLockHolder::~SpinLockHolder(&local_b8);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_a0);
  state->frequency = this->frequency_;
  state->callback_count = this->callback_count_;
  state->allowed = (bool)(this->allowed_ & 1);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(block.sig_set_.__val + 0xf));
  return;
}

Assistant:

void ProfileHandler::GetState(ProfileHandlerState* state) {
  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);  // Protects interrupts_.
    state->interrupts = interrupts_;
  }
  state->frequency = frequency_;
  state->callback_count = callback_count_;
  state->allowed = allowed_;
}